

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O2

void SndEmu_FreeDevLinkData(DEV_INFO *devInf)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = devInf->linkDevCount;
  if (uVar1 != 0) {
    lVar2 = 8;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      free(*(void **)(&devInf->linkDevs->devID + lVar2));
      uVar1 = devInf->linkDevCount;
      lVar2 = lVar2 + 0x10;
    }
    free(devInf->linkDevs);
    devInf->linkDevs = (DEVLINK_INFO *)0x0;
    devInf->linkDevCount = 0;
  }
  return;
}

Assistant:

void SndEmu_FreeDevLinkData(DEV_INFO* devInf)
{
	UINT32 curLDev;
	
	if (! devInf->linkDevCount)
		return;
	
	for (curLDev = 0; curLDev < devInf->linkDevCount; curLDev ++)
		free(devInf->linkDevs[curLDev].cfg);
	free(devInf->linkDevs);	devInf->linkDevs = NULL;
	devInf->linkDevCount = 0;
	
	return;
}